

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

Point __thiscall MarkerIndex::get_node_position(MarkerIndex *this,Node *node)

{
  bool bVar1;
  pointer ppVar2;
  pair<const_MarkerIndex::Node_*const,_Point> local_50;
  Point local_40;
  _Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false> local_38;
  Node *current_node;
  _Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false> local_28;
  iterator cache_entry;
  Node *node_local;
  MarkerIndex *this_local;
  Point position;
  
  cache_entry.super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>)
           (_Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>)node;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
       ::find(&this->node_position_cache,(key_type *)&cache_entry);
  current_node = (Node *)std::
                         unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
                         ::end(&this->node_position_cache);
  bVar1 = std::__detail::operator==
                    (&local_28,
                     (_Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false> *
                     )&current_node);
  if (bVar1) {
    this_local = *(MarkerIndex **)
                  ((long)cache_entry.
                         super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>
                         ._M_cur + 0x18);
    for (local_38 = cache_entry.
                    super__Node_iterator_base<std::pair<const_MarkerIndex::Node_*const,_Point>,_false>
                    ._M_cur;
        ((local_38._M_cur)->super__Hash_node_base)._M_nxt != (_Hash_node_base *)0x0;
        local_38._M_cur = (__node_type *)((local_38._M_cur)->super__Hash_node_base)._M_nxt) {
      if ((__node_type *)((local_38._M_cur)->super__Hash_node_base)._M_nxt[2]._M_nxt ==
          local_38._M_cur) {
        local_40 = Point::traverse((Point *)(((local_38._M_cur)->super__Hash_node_base)._M_nxt + 3),
                                   (Point *)&this_local);
        this_local = (MarkerIndex *)local_40;
      }
    }
    std::pair<const_MarkerIndex::Node_*const,_Point>::
    pair<const_MarkerIndex::Node_*&,_Point_&,_true>
              (&local_50,(Node **)&cache_entry,(Point *)&this_local);
    std::
    unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
    ::insert(&this->node_position_cache,&local_50);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_MarkerIndex::Node_*const,_Point>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_MarkerIndex::Node_*const,_Point>,_false,_false>
                         *)&local_28);
    this_local = *(MarkerIndex **)&ppVar2->second;
  }
  return (Point)this_local;
}

Assistant:

Point MarkerIndex::get_node_position(const Node *node) const {
  auto cache_entry = node_position_cache.find(node);
  if (cache_entry == node_position_cache.end()) {
    Point position = node->left_extent;
    const Node *current_node = node;
    while (current_node->parent) {
      if (current_node->parent->right == current_node) {
        position = current_node->parent->left_extent.traverse(position);
      }

      current_node = current_node->parent;
    }
    node_position_cache.insert({node, position});
    return position;
  } else {
    return cache_entry->second;
  }
}